

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::hide_helper(QWidgetPrivate *this)

{
  uint uVar1;
  QWidget *p;
  bool bVar2;
  QGraphicsProxyWidget *pQVar3;
  QWidget *pQVar4;
  QWidgetRepaintManager *this_00;
  short sVar5;
  uint uVar6;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined1 *puStack_50;
  code *local_48;
  undefined8 local_40;
  QWidget *pQStack_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  p = *(QWidget **)&this->field_0x8;
  uVar1 = (p->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  uVar6 = uVar1 & 0xff;
  if (((uVar1 & 1) == 0) || (bVar2 = bypassGraphicsProxyWidget(p), bVar2)) {
    if (uVar6 != 9) goto LAB_002fe14b;
  }
  else {
    pQVar3 = nearestGraphicsProxyWidget(*(QWidget **)(*(long *)&p->field_0x8 + 0x10));
    if ((uVar6 != 9) || (pQVar3 != (QGraphicsProxyWidget *)0x0)) goto LAB_002fe14b;
  }
  QApplicationPrivate::closePopup(*(QApplicationPrivate **)(QCoreApplication::self + 8),p);
LAB_002fe14b:
  QWidget::setAttribute(p,WA_Mapped,false);
  hide_sys(this);
  sVar5 = (short)p->data->widget_attributes;
  if (sVar5 < 0) {
    QWidget::setAttribute(p,WA_WState_Visible,false);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QHideEvent::QHideEvent((QHideEvent *)&local_58);
    QCoreApplication::sendEvent(&p->super_QObject,(QEvent *)&local_58);
    hideChildren(this,false);
    QApplicationPrivate::sendSyntheticEnterLeave
              (*(QApplicationPrivate **)(QCoreApplication::self + 8),p);
    pQVar4 = QApplication::focusWidget();
    while( true ) {
      if ((pQVar4 == (QWidget *)0x0) ||
         (((pQVar4->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) goto LAB_002fe21c;
      if (pQVar4 == p) break;
      pQVar4 = *(QWidget **)(*(long *)&pQVar4->field_0x8 + 0x10);
    }
    (**(code **)(*(long *)p + 0x198))(p,1);
  }
  else {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QHideEvent::QHideEvent((QHideEvent *)&local_58);
    QCoreApplication::sendEvent(&p->super_QObject,(QEvent *)&local_58);
    hideChildren(this,false);
  }
LAB_002fe21c:
  this_00 = maybeRepaintManager(this);
  if (this_00 != (QWidgetRepaintManager *)0x0) {
    QWidgetRepaintManager::removeDirtyWidget((QWidgetRepaintManager *)this_00,p);
  }
  if (sVar5 < 0) {
    local_48 = QFont::strikeOut;
    local_40 = 0xaaaaaaaa00008003;
    local_30 = 0xaaaaaaaaffffffff;
    pQStack_38 = p;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
  }
  QHideEvent::~QHideEvent((QHideEvent *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::hide_helper()
{
    Q_Q(QWidget);

    bool isEmbedded = false;
#if QT_CONFIG(graphicsview)
    isEmbedded = q->isWindow() && !bypassGraphicsProxyWidget(q) && nearestGraphicsProxyWidget(q->parentWidget()) != nullptr;
#else
    Q_UNUSED(isEmbedded);
#endif

    if (!isEmbedded && (q->windowType() == Qt::Popup))
        qApp->d_func()->closePopup(q);

    q->setAttribute(Qt::WA_Mapped, false);
    hide_sys();

    bool wasVisible = q->testAttribute(Qt::WA_WState_Visible);

    if (wasVisible) {
        q->setAttribute(Qt::WA_WState_Visible, false);

    }

    QHideEvent hideEvent;
    QCoreApplication::sendEvent(q, &hideEvent);
    hideChildren(false);

    // next bit tries to move the focus if the focus widget is now
    // hidden.
    if (wasVisible) {
        qApp->d_func()->sendSyntheticEnterLeave(q);
        QWidget *fw = QApplication::focusWidget();
        while (fw &&  !fw->isWindow()) {
            if (fw == q) {
                q->focusNextPrevChild(true);
                break;
            }
            fw = fw->parentWidget();
        }
    }

    if (QWidgetRepaintManager *repaintManager = maybeRepaintManager())
        repaintManager->removeDirtyWidget(q);

#if QT_CONFIG(accessibility)
    if (wasVisible) {
        QAccessibleEvent event(q, QAccessible::ObjectHide);
        QAccessible::updateAccessibility(&event);
    }
#endif
}